

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O0

int32_t uloc_getDisplayName_63
                  (char *locale,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  UChar *pUVar4;
  char *keyword;
  int local_13c;
  int local_128;
  int local_124;
  int local_114;
  int32_t i_1;
  int32_t padLen;
  int32_t i;
  UChar *plimit;
  int32_t vlen;
  char *kw;
  int32_t local_e8;
  int32_t len;
  int32_t cap;
  int iStack_dc;
  UBool subdone;
  int32_t resti;
  int32_t subi;
  UEnumeration *kenum;
  int local_c8;
  int32_t restPos;
  int32_t restLen;
  int32_t langPos;
  int32_t langLen;
  int32_t patPos;
  UChar *p;
  UChar *pUStack_a8;
  int32_t t;
  UChar *p1_1;
  UChar *p0_1;
  UChar *p1;
  UChar *p0;
  UResourceBundle *dspbundle;
  UResourceBundle *locbundle;
  UErrorCode status;
  int32_t langi;
  UChar UStack_68;
  UBool retry;
  UBool haveRest;
  UBool haveLang;
  UChar formatReplaceCloseParen;
  UChar formatCloseParen;
  UChar formatReplaceOpenParen;
  UChar formatOpenParen;
  int32_t sub1Pos;
  int32_t sub0Pos;
  int32_t patLen;
  UChar *pattern;
  UChar *pUStack_48;
  int32_t sepLen;
  UChar *separator;
  UErrorCode *pUStack_38;
  int32_t length;
  UErrorCode *pErrorCode_local;
  UChar *pUStack_28;
  int32_t destCapacity_local;
  UChar *dest_local;
  char *displayLocale_local;
  char *locale_local;
  
  pattern._4_4_ = 0;
  sub1Pos = 0;
  _haveRest = L'(';
  UStack_68 = L'[';
  langi._2_2_ = L')';
  langi._0_2_ = L']';
  status._3_1_ = 1;
  status._2_1_ = U_BAD_VARIABLE_DEFINITION >> 0x10;
  status._1_1_ = U_ZERO_ERROR >> 8;
  locbundle._4_4_ = 0;
  if ((pErrorCode == (UErrorCode *)0x0) ||
     (pUStack_38 = pErrorCode, pErrorCode_local._4_4_ = destCapacity, pUStack_28 = dest,
     dest_local = (UChar *)displayLocale, displayLocale_local = locale,
     UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    locale_local._4_4_ = 0;
  }
  else if ((pErrorCode_local._4_4_ < 0) ||
          ((0 < pErrorCode_local._4_4_ && (pUStack_28 == (UChar *)0x0)))) {
    *pUStack_38 = U_ILLEGAL_ARGUMENT_ERROR;
    locale_local._4_4_ = 0;
  }
  else {
    locbundle._0_4_ = 0;
    dspbundle = ures_open_63("icudt63l-lang",(char *)dest_local,(UErrorCode *)&locbundle);
    p0 = (UChar *)ures_getByKeyWithFallback_63
                            (dspbundle,"localeDisplayPattern",(UResourceBundle *)0x0,
                             (UErrorCode *)&locbundle);
    pUStack_48 = ures_getStringByKeyWithFallback_63
                           ((UResourceBundle *)p0,"separator",(int32_t *)((long)&pattern + 4),
                            (UErrorCode *)&locbundle);
    _sub0Pos = ures_getStringByKeyWithFallback_63
                         ((UResourceBundle *)p0,"pattern",&sub1Pos,(UErrorCode *)&locbundle);
    ures_close_63((UResourceBundle *)p0);
    ures_close_63(dspbundle);
    if (pattern._4_4_ == 0) {
      pUStack_48 = L"{0}, {1}";
    }
    p1 = u_strstr_63(pUStack_48,L"{0}");
    p0_1 = u_strstr_63(pUStack_48,L"{1}");
    if (((p1 == (UChar *)0x0) || (p0_1 == (UChar *)0x0)) || (p0_1 < p1)) {
      *pUStack_38 = U_ILLEGAL_ARGUMENT_ERROR;
      locale_local._4_4_ = 0;
    }
    else {
      pUStack_48 = p1 + 3;
      pattern._4_4_ = (int)((long)p0_1 - (long)pUStack_48 >> 1);
      if ((sub1Pos == 0) ||
         ((sub1Pos == 9 && (iVar2 = u_strncmp_63(_sub0Pos,L"{0} ({1})",9), iVar2 == 0)))) {
        _sub0Pos = L"{0} ({1})";
        sub1Pos = 9;
        _formatReplaceOpenParen = 0;
        _formatReplaceCloseParen = 5;
      }
      else {
        p1_1 = u_strstr_63(_sub0Pos,L"{0}");
        pUStack_a8 = u_strstr_63(_sub0Pos,L"{1}");
        if ((p1_1 == (UChar *)0x0) || (pUStack_a8 == (UChar *)0x0)) {
          *pUStack_38 = U_ILLEGAL_ARGUMENT_ERROR;
          return 0;
        }
        _formatReplaceOpenParen = (int)((long)p1_1 - (long)_sub0Pos >> 1);
        iVar3 = (int)((long)pUStack_a8 - (long)_sub0Pos >> 1);
        _formatReplaceCloseParen = iVar3;
        if (iVar3 < _formatReplaceOpenParen) {
          locbundle._4_4_ = 1;
          p._4_4_ = _formatReplaceOpenParen;
          _formatReplaceCloseParen = _formatReplaceOpenParen;
          _formatReplaceOpenParen = iVar3;
        }
        pUVar4 = u_strchr_63(_sub0Pos,L'（');
        if (pUVar4 != (UChar *)0x0) {
          _haveRest = L'（';
          UStack_68 = L'［';
          langi._2_2_ = L'）';
          langi._0_2_ = L'］';
        }
      }
      do {
        _langLen = pUStack_28;
        langPos = 0;
        restLen = 0;
        restPos = 0;
        local_c8 = 0;
        kenum._4_4_ = 0;
        _resti = (UEnumeration *)0x0;
        if (_formatReplaceOpenParen == 0) {
          separator._4_4_ = 0;
        }
        else {
          if (pErrorCode_local._4_4_ < _formatReplaceOpenParen) {
            langPos = _formatReplaceOpenParen;
          }
          else {
            while (langPos < _formatReplaceOpenParen) {
              *_langLen = _sub0Pos[langPos];
              langPos = langPos + 1;
              _langLen = _langLen + 1;
            }
          }
          separator._4_4_ = _formatReplaceOpenParen;
        }
        iStack_dc = 0;
        cap = 0;
        while (iStack_dc < 2) {
          len._3_1_ = '\0';
          local_e8 = pErrorCode_local._4_4_ - separator._4_4_;
          if (local_e8 < 1) {
            local_e8 = 0;
          }
          else {
            _langLen = pUStack_28 + separator._4_4_;
          }
          if (iStack_dc == locbundle._4_4_) {
            if (status._3_1_ != U_ZERO_ERROR >> 0x18) {
              restPos = separator._4_4_;
              restLen = uloc_getDisplayLanguage_63
                                  (displayLocale_local,(char *)dest_local,_langLen,local_e8,
                                   pUStack_38);
              separator._4_4_ = restLen + separator._4_4_;
              status._3_1_ = 0 < restLen;
            }
            len._3_1_ = '\x01';
          }
          else if (status._2_1_ == U_ZERO_ERROR >> 0x10) {
            len._3_1_ = '\x01';
          }
          else {
            iVar3 = cap + 1;
            switch(cap) {
            case 0:
              kenum._4_4_ = separator._4_4_;
              cap = iVar3;
              kw._4_4_ = uloc_getDisplayScriptInContext_63
                                   (displayLocale_local,(char *)dest_local,_langLen,local_e8,
                                    pUStack_38);
              break;
            case 1:
              cap = iVar3;
              kw._4_4_ = uloc_getDisplayCountry_63
                                   (displayLocale_local,(char *)dest_local,_langLen,local_e8,
                                    pUStack_38);
              break;
            case 2:
              cap = iVar3;
              kw._4_4_ = uloc_getDisplayVariant_63
                                   (displayLocale_local,(char *)dest_local,_langLen,local_e8,
                                    pUStack_38);
              break;
            case 3:
              cap = iVar3;
              _resti = uloc_openKeywords_63(displayLocale_local,pUStack_38);
              iVar3 = cap;
            default:
              cap = iVar3;
              keyword = uenum_next_63(_resti,(int32_t *)((long)&kw + 4),pUStack_38);
              if (keyword == (char *)0x0) {
                uenum_close_63(_resti);
                kw._4_4_ = 0;
                len._3_1_ = '\x01';
              }
              else {
                kw._4_4_ = uloc_getDisplayKeyword_63
                                     (keyword,(char *)dest_local,_langLen,local_e8,pUStack_38);
                if (kw._4_4_ != 0) {
                  if (kw._4_4_ < local_e8) {
                    _langLen[kw._4_4_] = L'=';
                  }
                  kw._4_4_ = kw._4_4_ + 1;
                  local_e8 = local_e8 - kw._4_4_;
                  if (local_e8 < 1) {
                    local_e8 = 0;
                  }
                  else {
                    _langLen = _langLen + kw._4_4_;
                  }
                }
                if (*pUStack_38 == U_BUFFER_OVERFLOW_ERROR) {
                  *pUStack_38 = U_ZERO_ERROR;
                }
                iVar2 = uloc_getDisplayKeywordValue_63
                                  (displayLocale_local,keyword,(char *)dest_local,_langLen,local_e8,
                                   pUStack_38);
                if (kw._4_4_ != 0) {
                  if (iVar2 == 0) {
                    kw._4_4_ = kw._4_4_ + -1;
                  }
                  local_e8 = pErrorCode_local._4_4_ - separator._4_4_;
                  if (local_e8 < 1) {
                    local_e8 = 0;
                  }
                  else {
                    _langLen = pUStack_28 + separator._4_4_;
                  }
                }
                kw._4_4_ = iVar2 + kw._4_4_;
              }
            }
            if (kw._4_4_ < 1) {
              if (len._3_1_ != '\0') {
                if (separator._4_4_ != kenum._4_4_) {
                  separator._4_4_ = separator._4_4_ - pattern._4_4_;
                }
                local_c8 = separator._4_4_ - kenum._4_4_;
                status._2_1_ = 0 < local_c8;
              }
            }
            else {
              if (kw._4_4_ + pattern._4_4_ <= local_e8) {
                pUVar4 = _langLen + kw._4_4_;
                for (; _langLen < pUVar4; _langLen = _langLen + 1) {
                  if (*_langLen == _haveRest) {
                    *_langLen = UStack_68;
                  }
                  else if (*_langLen == langi._2_2_) {
                    *_langLen = (UChar)langi;
                  }
                }
                for (i_1 = 0; i_1 < pattern._4_4_; i_1 = i_1 + 1) {
                  *_langLen = pUStack_48[i_1];
                  _langLen = _langLen + 1;
                }
              }
              separator._4_4_ = kw._4_4_ + pattern._4_4_ + separator._4_4_;
            }
          }
          if (*pUStack_38 == U_BUFFER_OVERFLOW_ERROR) {
            *pUStack_38 = U_ZERO_ERROR;
          }
          if (len._3_1_ != '\0') {
            if ((status._3_1_ == U_ZERO_ERROR >> 0x18) || (status._2_1_ == U_ZERO_ERROR >> 0x10)) {
              if (iStack_dc == 0) {
                _formatReplaceOpenParen = 0;
                separator._4_4_ = 0;
              }
              else if (0 < separator._4_4_) {
                if (status._3_1_ == U_ZERO_ERROR >> 0x18) {
                  local_128 = local_c8;
                }
                else {
                  local_128 = restLen;
                }
                separator._4_4_ = local_128;
                if ((pUStack_28 != (UChar *)0x0) && (_formatReplaceOpenParen != 0)) {
                  if (pErrorCode_local._4_4_ < _formatReplaceOpenParen + local_128) {
                    _formatReplaceOpenParen = 0;
                    status._1_1_ = 1;
                  }
                  else {
                    if (status._3_1_ == U_ZERO_ERROR >> 0x18) {
                      local_13c = kenum._4_4_;
                    }
                    else {
                      local_13c = restPos;
                    }
                    u_memmove_63(pUStack_28,pUStack_28 + local_13c,local_128);
                  }
                }
              }
            }
            else {
              langPos = langPos + 3;
              if (iStack_dc == 0) {
                local_124 = _formatReplaceCloseParen;
              }
              else {
                local_124 = sub1Pos;
              }
              local_124 = local_124 - langPos;
              if (separator._4_4_ + local_124 < pErrorCode_local._4_4_) {
                _langLen = pUStack_28 + separator._4_4_;
                for (local_114 = 0; local_114 < local_124; local_114 = local_114 + 1) {
                  *_langLen = _sub0Pos[langPos];
                  langPos = langPos + 1;
                  _langLen = _langLen + 1;
                }
              }
              else {
                langPos = local_124 + langPos;
              }
              separator._4_4_ = local_124 + separator._4_4_;
            }
            iStack_dc = iStack_dc + 1;
          }
        }
      } while (status._1_1_ != U_ZERO_ERROR >> 8);
      locale_local._4_4_ =
           u_terminateUChars_63(pUStack_28,pErrorCode_local._4_4_,separator._4_4_,pUStack_38);
    }
  }
  return locale_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayName(const char *locale,
                    const char *displayLocale,
                    UChar *dest, int32_t destCapacity,
                    UErrorCode *pErrorCode)
{
    static const UChar defaultSeparator[9] = { 0x007b, 0x0030, 0x007d, 0x002c, 0x0020, 0x007b, 0x0031, 0x007d, 0x0000 }; /* "{0}, {1}" */
    static const UChar sub0[4] = { 0x007b, 0x0030, 0x007d , 0x0000 } ; /* {0} */
    static const UChar sub1[4] = { 0x007b, 0x0031, 0x007d , 0x0000 } ; /* {1} */
    static const int32_t subLen = 3;
    static const UChar defaultPattern[10] = {
        0x007b, 0x0030, 0x007d, 0x0020, 0x0028, 0x007b, 0x0031, 0x007d, 0x0029, 0x0000
    }; /* {0} ({1}) */
    static const int32_t defaultPatLen = 9;
    static const int32_t defaultSub0Pos = 0;
    static const int32_t defaultSub1Pos = 5;

    int32_t length; /* of formatted result */

    const UChar *separator;
    int32_t sepLen = 0;
    const UChar *pattern;
    int32_t patLen = 0;
    int32_t sub0Pos, sub1Pos;
    
    UChar formatOpenParen         = 0x0028; // (
    UChar formatReplaceOpenParen  = 0x005B; // [
    UChar formatCloseParen        = 0x0029; // )
    UChar formatReplaceCloseParen = 0x005D; // ]

    UBool haveLang = TRUE; /* assume true, set false if we find we don't have
                              a lang component in the locale */
    UBool haveRest = TRUE; /* assume true, set false if we find we don't have
                              any other component in the locale */
    UBool retry = FALSE; /* set true if we need to retry, see below */

    int32_t langi = 0; /* index of the language substitution (0 or 1), virtually always 0 */

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    {
        UErrorCode status = U_ZERO_ERROR;
        UResourceBundle* locbundle=ures_open(U_ICUDATA_LANG, displayLocale, &status);
        UResourceBundle* dspbundle=ures_getByKeyWithFallback(locbundle, _kLocaleDisplayPattern,
                                                             NULL, &status);

        separator=ures_getStringByKeyWithFallback(dspbundle, _kSeparator, &sepLen, &status);
        pattern=ures_getStringByKeyWithFallback(dspbundle, _kPattern, &patLen, &status);

        ures_close(dspbundle);
        ures_close(locbundle);
    }

    /* If we couldn't find any data, then use the defaults */
    if(sepLen == 0) {
       separator = defaultSeparator;
    }
    /* #10244: Even though separator is now a pattern, it is awkward to handle it as such
     * here since we are trying to build the display string in place in the dest buffer,
     * and to handle it as a pattern would entail having separate storage for the
     * substrings that need to be combined (the first of which may be the result of
     * previous such combinations). So for now we continue to treat the portion between
     * {0} and {1} as a string to be appended when joining substrings, ignoring anything
     * that is before {0} or after {1} (no existing separator pattern has any such thing).
     * This is similar to how pattern is handled below.
     */
    {
        UChar *p0=u_strstr(separator, sub0);
        UChar *p1=u_strstr(separator, sub1);
        if (p0==NULL || p1==NULL || p1<p0) {
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        separator = (const UChar *)p0 + subLen;
        sepLen = static_cast<int32_t>(p1 - separator);
    }

    if(patLen==0 || (patLen==defaultPatLen && !u_strncmp(pattern, defaultPattern, patLen))) {
        pattern=defaultPattern;
        patLen=defaultPatLen;
        sub0Pos=defaultSub0Pos;
        sub1Pos=defaultSub1Pos;
        // use default formatOpenParen etc. set above
    } else { /* non-default pattern */
        UChar *p0=u_strstr(pattern, sub0);
        UChar *p1=u_strstr(pattern, sub1);
        if (p0==NULL || p1==NULL) {
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        sub0Pos = static_cast<int32_t>(p0-pattern);
        sub1Pos = static_cast<int32_t>(p1-pattern);
        if (sub1Pos < sub0Pos) { /* a very odd pattern */
            int32_t t=sub0Pos; sub0Pos=sub1Pos; sub1Pos=t;
            langi=1;
        }
        if (u_strchr(pattern, 0xFF08) != NULL) {
            formatOpenParen         = 0xFF08; // fullwidth (
            formatReplaceOpenParen  = 0xFF3B; // fullwidth [
            formatCloseParen        = 0xFF09; // fullwidth )
            formatReplaceCloseParen = 0xFF3D; // fullwidth ]
        }
    }

    /* We loop here because there is one case in which after the first pass we could need to
     * reextract the data.  If there's initial padding before the first element, we put in
     * the padding and then write that element.  If it turns out there's no second element,
     * we didn't need the padding.  If we do need the data (no preflight), and the first element
     * would have fit but for the padding, we need to reextract.  In this case (only) we
     * adjust the parameters so padding is not added, and repeat.
     */
    do {
        UChar* p=dest;
        int32_t patPos=0; /* position in the pattern, used for non-substitution portions */
        int32_t langLen=0; /* length of language substitution */
        int32_t langPos=0; /* position in output of language substitution */
        int32_t restLen=0; /* length of 'everything else' substitution */
        int32_t restPos=0; /* position in output of 'everything else' substitution */
        UEnumeration* kenum = NULL; /* keyword enumeration */

        /* prefix of pattern, extremely likely to be empty */
        if(sub0Pos) {
            if(destCapacity >= sub0Pos) {
                while (patPos < sub0Pos) {
                    *p++ = pattern[patPos++];
                }
            } else {
                patPos=sub0Pos;
            }
            length=sub0Pos;
        } else {
            length=0;
        }

        for(int32_t subi=0,resti=0;subi<2;) { /* iterate through patterns 0 and 1*/
            UBool subdone = FALSE; /* set true when ready to move to next substitution */

            /* prep p and cap for calls to get display components, pin cap to 0 since
               they complain if cap is negative */
            int32_t cap=destCapacity-length;
            if (cap <= 0) {
                cap=0;
            } else {
                p=dest+length;
            }

            if (subi == langi) { /* {0}*/
                if(haveLang) {
                    langPos=length;
                    langLen=uloc_getDisplayLanguage(locale, displayLocale, p, cap, pErrorCode);
                    length+=langLen;
                    haveLang=langLen>0;
                }
                subdone=TRUE;
            } else { /* {1} */
                if(!haveRest) {
                    subdone=TRUE;
                } else {
                    int32_t len; /* length of component (plus other stuff) we just fetched */
                    switch(resti++) {
                        case 0:
                            restPos=length;
                            len=uloc_getDisplayScriptInContext(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 1:
                            len=uloc_getDisplayCountry(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 2:
                            len=uloc_getDisplayVariant(locale, displayLocale, p, cap, pErrorCode);
                            break;
                        case 3:
                            kenum = uloc_openKeywords(locale, pErrorCode);
                            U_FALLTHROUGH;
                        default: {
                            const char* kw=uenum_next(kenum, &len, pErrorCode);
                            if (kw == NULL) {
                                uenum_close(kenum);
                                len=0; /* mark that we didn't add a component */
                                subdone=TRUE;
                            } else {
                                /* incorporating this behavior into the loop made it even more complex,
                                   so just special case it here */
                                len = uloc_getDisplayKeyword(kw, displayLocale, p, cap, pErrorCode);
                                if(len) {
                                    if(len < cap) {
                                        p[len]=0x3d; /* '=', assume we'll need it */
                                    }
                                    len+=1;

                                    /* adjust for call to get keyword */
                                    cap-=len;
                                    if(cap <= 0) {
                                        cap=0;
                                    } else {
                                        p+=len;
                                    }
                                }
                                /* reset for call below */
                                if(*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
                                    *pErrorCode=U_ZERO_ERROR;
                                }
                                int32_t vlen = uloc_getDisplayKeywordValue(locale, kw, displayLocale,
                                                                           p, cap, pErrorCode);
                                if(len) {
                                    if(vlen==0) {
                                        --len; /* remove unneeded '=' */
                                    }
                                    /* restore cap and p to what they were at start */
                                    cap=destCapacity-length;
                                    if(cap <= 0) {
                                        cap=0;
                                    } else {
                                        p=dest+length;
                                    }
                                }
                                len+=vlen; /* total we added for key + '=' + value */
                            }
                        } break;
                    } /* end switch */

                    if (len>0) {
                        /* we addeed a component, so add separator and write it if there's room. */
                        if(len+sepLen<=cap) {
                            const UChar * plimit = p + len;
                            for (; p < plimit; p++) {
                                if (*p == formatOpenParen) {
                                    *p = formatReplaceOpenParen;
                                } else if (*p == formatCloseParen) {
                                    *p = formatReplaceCloseParen;
                                }
                            }
                            for(int32_t i=0;i<sepLen;++i) {
                                *p++=separator[i];
                            }
                        }
                        length+=len+sepLen;
                    } else if(subdone) {
                        /* remove separator if we added it */
                        if (length!=restPos) {
                            length-=sepLen;
                        }
                        restLen=length-restPos;
                        haveRest=restLen>0;
                    }
                }
            }

            if(*pErrorCode == U_BUFFER_OVERFLOW_ERROR) {
                *pErrorCode=U_ZERO_ERROR;
            }

            if(subdone) {
                if(haveLang && haveRest) {
                    /* append internal portion of pattern, the first time,
                       or last portion of pattern the second time */
                    int32_t padLen;
                    patPos+=subLen;
                    padLen=(subi==0 ? sub1Pos : patLen)-patPos;
                    if(length+padLen < destCapacity) {
                        p=dest+length;
                        for(int32_t i=0;i<padLen;++i) {
                            *p++=pattern[patPos++];
                        }
                    } else {
                        patPos+=padLen;
                    }
                    length+=padLen;
                } else if(subi==0) {
                    /* don't have first component, reset for second component */
                    sub0Pos=0;
                    length=0;
                } else if(length>0) {
                    /* true length is the length of just the component we got. */
                    length=haveLang?langLen:restLen;
                    if(dest && sub0Pos!=0) {
                        if (sub0Pos+length<=destCapacity) {
                            /* first component not at start of result,
                               but we have full component in buffer. */
                            u_memmove(dest, dest+(haveLang?langPos:restPos), length);
                        } else {
                            /* would have fit, but didn't because of pattern prefix. */
                            sub0Pos=0; /* stops initial padding (and a second retry,
                                          so we won't end up here again) */
                            retry=TRUE;
                        }
                    }
                }

                ++subi; /* move on to next substitution */
            }
        }
    } while(retry);

    return u_terminateUChars(dest, destCapacity, length, pErrorCode);
}